

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-records_frequencies.c
# Opt level: O2

void CGTFS_RecordFrequency(void)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  frequency_t *pfVar6;
  char **ppcVar7;
  byte bVar8;
  frequency_t a;
  char *field_values [5];
  char *field_names [5];
  
  bVar8 = 0;
  iVar1 = greatest_test_pre("frequency_read");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      iVar1 = -1;
      field_names[4] = "exact_times";
      field_names[2] = "end_time";
      field_names[3] = "headway_secs";
      field_names[0] = "trip_id";
      field_names[1] = "start_time";
      field_values[4] = "";
      field_values[2] = "07:00:00";
      field_values[3] = "1200";
      field_values[0] = "0xC0FFEE";
      field_values[1] = "05:00:00";
      read_frequency(&a,5,field_names,field_values);
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar2 = greatest_do_assert_equal_t("0xC0FFEE",&a,&greatest_type_info_string,(void *)0x0);
      if (iVar2 == 0) {
        greatest_info.fail_line = 0x13;
        if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
LAB_00120762:
          greatest_info.msg = "type_info->equal callback missing!";
        }
        else {
          greatest_info.msg = "\"0xC0FFEE\" != freq_1.trip_id";
        }
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar2 = greatest_do_assert_equal_t
                          ("05:00:00",a.start_time,&greatest_type_info_string,(void *)0x0);
        if (iVar2 == 0) {
          greatest_info.fail_line = 0x14;
          if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_00120762;
          greatest_info.msg = "\"05:00:00\" != freq_1.start_time";
        }
        else {
          greatest_info.assertions = greatest_info.assertions + 1;
          iVar2 = greatest_do_assert_equal_t
                            ("07:00:00",a.end_time,&greatest_type_info_string,(void *)0x0);
          if (iVar2 == 0) {
            greatest_info.fail_line = 0x15;
            if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_00120762;
            greatest_info.msg = "\"07:00:00\" != freq_1.end_time";
          }
          else if (a.headway_secs == 0x4b0) {
            greatest_info.assertions = greatest_info.assertions + 2;
            if (a.exact_times == TE_NOT_EXACT) {
              greatest_info.msg = (char *)0x0;
              iVar1 = 0;
              goto LAB_001207a0;
            }
            greatest_info.fail_line = 0x17;
            greatest_info.msg = "TE_NOT_EXACT != freq_1.exact_times";
          }
          else {
            greatest_info.fail_line = 0x16;
            greatest_info.msg = "1200 != freq_1.headway_secs";
            greatest_info.assertions = greatest_info.assertions + 1;
          }
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_frequencies.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_001208f8;
    }
LAB_001207a0:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("frequency_compare");
  if (iVar1 == 0) {
    return;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
  if (iVar1 == 0) {
    lVar4 = 0x17;
    pcVar5 = "EXAMPLEtrip";
    pfVar6 = &a;
    for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(undefined4 *)pfVar6->trip_id = *(undefined4 *)pcVar5;
      pcVar5 = pcVar5 + ((ulong)bVar8 * -2 + 1) * 4;
      pfVar6 = (frequency_t *)((long)pfVar6 + (ulong)bVar8 * -8 + 4);
    }
    pcVar5 = "EXAMPLEtrip";
    pfVar6 = (frequency_t *)field_names;
    for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(undefined4 *)pfVar6->trip_id = *(undefined4 *)pcVar5;
      pcVar5 = pcVar5 + ((ulong)bVar8 * -2 + 1) * 4;
      pfVar6 = (frequency_t *)((long)pfVar6 + (ulong)bVar8 * -8 + 4);
    }
    pcVar5 = "EXAMPLEtrip";
    ppcVar7 = field_values;
    for (; lVar4 != 0; lVar4 = lVar4 + -1) {
      *(undefined4 *)ppcVar7 = *(undefined4 *)pcVar5;
      pcVar5 = pcVar5 + ((ulong)bVar8 * -2 + 1) * 4;
      ppcVar7 = (char **)((long)ppcVar7 + (ulong)bVar8 * -8 + 4);
    }
    greatest_info.assertions = greatest_info.assertions + 1;
    iVar1 = equal_frequency(&a,(frequency_t *)field_names);
    if (iVar1 == 1) {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = equal_frequency(&a,(frequency_t *)field_values);
      if (iVar1 == 0) {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = equal_frequency((frequency_t *)field_names,(frequency_t *)field_values);
        if (iVar1 == 0) {
          greatest_info.msg = (char *)0x0;
          iVar1 = 0;
          goto LAB_00120891;
        }
        greatest_info.fail_line = 0x37;
        greatest_info.msg = "0 != equal_frequency(&b, &c)";
      }
      else {
        greatest_info.fail_line = 0x36;
        greatest_info.msg = "0 != equal_frequency(&a, &c)";
      }
    }
    else {
      greatest_info.fail_line = 0x35;
      greatest_info.msg = "1 != equal_frequency(&a, &b)";
    }
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_frequencies.c"
    ;
    if ((greatest_info.flags & 4) != 0) {
LAB_001208f8:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_frequencies.c"
      ;
      abort();
    }
    iVar1 = -1;
  }
LAB_00120891:
  greatest_test_post(iVar1);
  return;
}

Assistant:

SUITE(CGTFS_RecordFrequency) {
    RUN_TEST(frequency_read);
    RUN_TEST(frequency_compare);
}